

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int xferCompatibleIndex(Index *pDest,Index *pSrc)

{
  ushort uVar1;
  int iVar2;
  ulong uVar3;
  
  uVar1 = pDest->nColumn;
  iVar2 = 0;
  if ((uVar1 == pSrc->nColumn) && (pDest->onError == pSrc->onError)) {
    uVar3 = 0;
    while (uVar1 != uVar3) {
      if (pSrc->aiColumn[uVar3] != pDest->aiColumn[uVar3]) {
        return 0;
      }
      if (pSrc->aSortOrder[uVar3] != pDest->aSortOrder[uVar3]) {
        return 0;
      }
      iVar2 = xferCompatibleCollation(pSrc->azColl[uVar3],pDest->azColl[uVar3]);
      uVar3 = uVar3 + 1;
      if (iVar2 == 0) {
        return 0;
      }
    }
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

static int xferCompatibleIndex(Index *pDest, Index *pSrc){
  int i;
  assert( pDest && pSrc );
  assert( pDest->pTable!=pSrc->pTable );
  if( pDest->nColumn!=pSrc->nColumn ){
    return 0;   /* Different number of columns */
  }
  if( pDest->onError!=pSrc->onError ){
    return 0;   /* Different conflict resolution strategies */
  }
  for(i=0; i<pSrc->nColumn; i++){
    if( pSrc->aiColumn[i]!=pDest->aiColumn[i] ){
      return 0;   /* Different columns indexed */
    }
    if( pSrc->aSortOrder[i]!=pDest->aSortOrder[i] ){
      return 0;   /* Different sort orders */
    }
    if( !xferCompatibleCollation(pSrc->azColl[i],pDest->azColl[i]) ){
      return 0;   /* Different collating sequences */
    }
  }

  /* If no test above fails then the indices must be compatible */
  return 1;
}